

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_itree_csc<PredictionData<float,unsigned_long>,unsigned_long>
               (WorkerForPredictCSC *workspace,vector<IsoTree,_std::allocator<IsoTree>_> *trees,
               IsoForest *model_outputs,PredictionData<float,_unsigned_long> *prediction_data,
               unsigned_long *tree_num,double *per_tree_depths,size_t curr_tree,
               bool has_range_penalty)

{
  MissingAction MVar1;
  pointer puVar2;
  char *split_categ;
  char *pcVar3;
  pointer pdVar4;
  ulong uVar5;
  unsigned_long uVar6;
  pointer pdVar7;
  size_t row_3;
  pointer pIVar8;
  pointer pIVar9;
  size_t sVar10;
  ulong uVar11;
  size_t *psVar12;
  size_t st;
  size_t row;
  ulong uVar13;
  size_t end_NA;
  unsigned_long *local_98;
  size_t local_90;
  size_t st_NA;
  size_t split_ix;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  
  local_98 = tree_num;
  pIVar8 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar9 = pIVar8 + curr_tree;
  if (pIVar8[curr_tree].tree_left == 0) {
    uVar11 = workspace->st;
    uVar5 = workspace->end;
    if (model_outputs->missing_action == Divide) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = uVar11; uVar13 <= uVar5; uVar13 = uVar13 + 1) {
        uVar6 = puVar2[uVar13];
        pdVar7[uVar6] = pdVar4[uVar6] * pIVar9->score + pdVar7[uVar6];
      }
    }
    else {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = uVar11; uVar13 <= uVar5; uVar13 = uVar13 + 1) {
        uVar6 = puVar2[uVar13];
        pdVar4[uVar6] = pIVar9->score + pdVar4[uVar6];
      }
    }
    if (tree_num != (unsigned_long *)0x0) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar13 = uVar11; uVar13 <= uVar5; uVar13 = uVar13 + 1) {
        tree_num[puVar2[uVar13]] = curr_tree;
      }
    }
    if (per_tree_depths == (double *)0x0) {
      return;
    }
    puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (; uVar11 <= uVar5; uVar11 = uVar11 + 1) {
      per_tree_depths[puVar2[uVar11]] = pIVar9->score;
    }
    return;
  }
  if ((((!has_range_penalty) || (curr_tree == 0)) || (model_outputs->missing_action == Divide)) &&
     (pIVar9->col_type == Numeric)) {
    puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2 + workspace->st,puVar2 + workspace->end + 1);
    pIVar8 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  local_90 = workspace->end;
  if (pIVar8[curr_tree].col_type == Categorical) {
    if (model_outputs->cat_split_type == SubSet) {
      split_categ = pIVar8[curr_tree].cat_split.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      pcVar3 = *(pointer *)
                ((long)&pIVar8[curr_tree].cat_split.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8);
      if (pcVar3 == split_categ) {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar8[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            local_90,model_outputs->missing_action,model_outputs->new_cat_action,
                            pIVar8[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar8[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
      else {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar8[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            local_90,split_categ,(int)pcVar3 - (int)split_categ,
                            model_outputs->missing_action,model_outputs->new_cat_action,
                            pIVar8[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar8[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
    }
    else if (model_outputs->cat_split_type == SingleCateg) {
      divide_subset_split((workspace->ix_arr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          prediction_data->categ_data +
                          pIVar8[curr_tree].col_num * prediction_data->nrows,workspace->st,local_90,
                          pIVar8[curr_tree].chosen_cat,model_outputs->missing_action,&st_NA,&end_NA,
                          &split_ix);
    }
  }
  else if (pIVar8[curr_tree].col_type == Numeric) {
    divide_subset_split<float,unsigned_long>
              ((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start,workspace->st,local_90,
               pIVar8[curr_tree].col_num,prediction_data->Xc,prediction_data->Xc_ind,
               prediction_data->Xc_indptr,pIVar8[curr_tree].num_split,model_outputs->missing_action,
               &st_NA,&end_NA,&split_ix);
  }
  if (((model_outputs->new_cat_action == Weighted) && (model_outputs->cat_split_type == SubSet)) &&
     (prediction_data->categ_data != (int *)0x0)) {
LAB_002dc6bd:
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (workspace->st < end_NA) {
      pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<double,std::allocator<double>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((vector<double,std::allocator<double>> *)&weights_arr,pdVar4,pdVar4 + end_NA);
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long*>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ix_arr,puVar2,
                 puVar2 + end_NA);
    }
    if (has_range_penalty) {
      pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = workspace->st;
      if (pIVar9[curr_tree].col_type == Numeric) {
        uVar5 = workspace->end;
        uVar13 = uVar5;
        if (uVar11 < st_NA) {
          workspace->end = st_NA - 1;
          add_csc_range_penalty<PredictionData<float,unsigned_long>>
                    (workspace,prediction_data,
                     (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,pIVar9[curr_tree].col_num,
                     pIVar9[curr_tree].range_low,pIVar9[curr_tree].range_high);
          uVar13 = workspace->end;
        }
        if (end_NA <= uVar13) {
          workspace->st = end_NA;
          workspace->end = uVar5;
          pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          add_csc_range_penalty<PredictionData<float,unsigned_long>>
                    (workspace,prediction_data,
                     (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,pIVar9[curr_tree].col_num,
                     pIVar9[curr_tree].range_low,pIVar9[curr_tree].range_high);
        }
        workspace->st = uVar11;
        workspace->end = uVar5;
      }
    }
    else {
      uVar11 = workspace->st;
    }
    if (uVar11 < end_NA) {
      if ((st_NA < end_NA) && (local_98 != (unsigned_long *)0x0 || per_tree_depths != (double *)0x0)
         ) goto LAB_002dcb77;
      workspace->end = end_NA - 1;
      pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar10 = st_NA; sVar10 < end_NA; sVar10 = sVar10 + 1) {
        uVar6 = puVar2[sVar10];
        pdVar4[uVar6] = pIVar9[curr_tree].pct_tree_left * pdVar4[uVar6];
      }
      traverse_itree_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,trees,model_outputs,prediction_data,local_98,per_tree_depths,
                 pIVar9[curr_tree].tree_left,has_range_penalty);
    }
    if (st_NA <= local_90) {
      if ((st_NA < end_NA) && (local_98 != (unsigned_long *)0x0 || per_tree_depths != (double *)0x0)
         ) {
LAB_002dcb77:
        throw_unsupported_pred_error();
      }
      workspace->st = st_NA;
      workspace->end = local_90;
      if ((long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        memmove((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start,
                weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
        if ((long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          memmove((workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&weights_arr);
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(&ix_arr);
      }
      pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; st_NA < end_NA; st_NA = st_NA + 1) {
        uVar6 = puVar2[st_NA];
        pdVar4[uVar6] = (1.0 - pIVar9[curr_tree].pct_tree_left) * pdVar4[uVar6];
      }
      traverse_itree_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,trees,model_outputs,prediction_data,local_98,per_tree_depths,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_right,has_range_penalty);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&weights_arr.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    MVar1 = model_outputs->missing_action;
    if (MVar1 == Impute) {
      psVar12 = &st_NA;
      if (0.5 <= (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].pct_tree_left) {
        psVar12 = &end_NA;
      }
      split_ix = *psVar12;
    }
    else {
      if (MVar1 == Divide) goto LAB_002dc6bd;
      if (MVar1 != Fail) {
        return;
      }
    }
    if (workspace->st < split_ix) {
      workspace->end = split_ix - 1;
      pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((has_range_penalty) && (pIVar9[curr_tree].col_type == Numeric)) {
        add_csc_range_penalty<PredictionData<float,unsigned_long>>
                  (workspace,prediction_data,(double *)0x0,pIVar9[curr_tree].col_num,
                   pIVar9[curr_tree].range_low,pIVar9[curr_tree].range_high);
        pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      traverse_itree_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,trees,model_outputs,prediction_data,local_98,per_tree_depths,
                 pIVar9[curr_tree].tree_left,has_range_penalty);
    }
    if (split_ix <= local_90) {
      workspace->st = split_ix;
      workspace->end = local_90;
      pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((has_range_penalty) && (pIVar9[curr_tree].col_type == Numeric)) {
        add_csc_range_penalty<PredictionData<float,unsigned_long>>
                  (workspace,prediction_data,(double *)0x0,pIVar9[curr_tree].col_num,
                   pIVar9[curr_tree].range_low,pIVar9[curr_tree].range_high);
        pIVar9 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      traverse_itree_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,trees,model_outputs,prediction_data,local_98,per_tree_depths,
                 pIVar9[curr_tree].tree_right,has_range_penalty);
    }
  }
  return;
}

Assistant:

void traverse_itree_csc(WorkerForPredictCSC   &workspace,
                        std::vector<IsoTree>  &trees,
                        IsoForest             &model_outputs,
                        PredictionData        &prediction_data,
                        sparse_ix *restrict   tree_num,
                        double *restrict      per_tree_depths,
                        size_t                curr_tree,
                        bool                  has_range_penalty)
{
    // if (trees[curr_tree].score >= 0)
    if (unlikely(trees[curr_tree].tree_left == 0))
    {
        if (model_outputs.missing_action != Divide)
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] += trees[curr_tree].score;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] += workspace.weights_arr[workspace.ix_arr[row]] * trees[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = trees[curr_tree].score;
        return;
    }

    /* in this case, the indices are sorted in the csc penalty function */
    if (!(has_range_penalty && model_outputs.missing_action != Divide && curr_tree > 0) && trees[curr_tree].col_type == Numeric)
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* TODO: should mix the splitting function with the range penalty */
    
    /* divide according to tree */
    size_t orig_end = workspace.end;
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                trees[curr_tree].num_split, model_outputs.missing_action,
                                st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch (model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }

    /* continue splitting recursively */
    if (unlikely(model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL))
        goto missing_action_divide;
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;

                if (has_range_penalty && trees[curr_tree].col_type == Numeric)
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          (double*)NULL,
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);

                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_left,
                                   has_range_penalty);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;

                if (has_range_penalty && trees[curr_tree].col_type == Numeric)
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          (double*)NULL,
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);

                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_right,
                                   has_range_penalty);
            }
            break;
        }

        case Divide:
        {
            missing_action_divide:
            /* TODO: maybe here it shouldn't copy the whole ix_arr,
               but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.data(),
                              workspace.ix_arr.data() + end_NA);
            }

            if (has_range_penalty && trees[curr_tree].col_type == Numeric)
            {
                size_t st = workspace.st;
                size_t end = workspace.end;

                if (workspace.st < st_NA)
                {
                    workspace.end = st_NA - 1;
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          workspace.weights_arr.data(),
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);
                }

                if (workspace.end >= end_NA)
                {
                    workspace.st = end_NA;
                    workspace.end = end;
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          workspace.weights_arr.data(),
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);
                }

                workspace.st = st;
                workspace.end = end;
            }

            if (end_NA > workspace.st)
            {
                if (st_NA < end_NA && (tree_num || per_tree_depths)) throw_unsupported_pred_error();
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_left,
                                   has_range_penalty);
            }

            if (st_NA <= orig_end)
            {
                if (st_NA < end_NA && (tree_num || per_tree_depths)) throw_unsupported_pred_error();
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (weights_arr.size())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_right,
                                   has_range_penalty);
            }
            break;
        }
    }
}